

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::GetBootstrapBasename
          (cpp *this,Options *options,string_view basename,string *bootstrap_basename)

{
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar1;
  bool bVar2;
  int iVar3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  pointer ppVar4;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  allocator<char> local_161;
  string local_160 [32];
  iterator local_140;
  undefined1 local_130 [8];
  const_iterator iter;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_50 [40];
  string *bootstrap_basename_local;
  Options *options_local;
  string_view basename_local;
  
  local_50._32_8_ = basename._M_str;
  basename_local._M_len = basename._M_len;
  if (((byte)this[0xca] & 1) == 0) {
    bootstrap_basename_local = (string *)this;
    options_local = options;
    if (GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
        ::bootstrap_mapping_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                                   ::bootstrap_mapping_abi_cxx11_);
      if (iVar3 != 0) {
        this_01 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)operator_new(0x20);
        iter.inner_.field_1._4_1_ = 1;
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[28],_const_char_(&)[32],_true>
                  (&local_110,(char (*) [28])"net/proto2/proto/descriptor",
                   (char (*) [32])"third_party/protobuf/descriptor");
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[34],_const_char_(&)[34],_true>
                  (&local_e0,(char (*) [34])"third_party/protobuf/cpp_features",
                   (char (*) [34])"third_party/protobuf/cpp_features");
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[37],_const_char_(&)[37],_true>
                  (&local_b0,(char (*) [37])"third_party/protobuf/compiler/plugin",
                   (char (*) [37])"third_party/protobuf/compiler/plugin");
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[34],_const_char_(&)[44],_true>
                  (&local_80,(char (*) [34])"net/proto2/compiler/proto/profile",
                   (char (*) [44])"net/proto2/compiler/proto/profile_bootstrap");
        local_50._0_8_ = &local_110;
        local_50._8_8_ = (char *)0x4;
        this_00 = (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&iter.inner_.field_1 + 5);
        std::
        allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(this_00);
        iVar1._M_len = local_50._8_8_;
        iVar1._M_array = (iterator)local_50._0_8_;
        absl::lts_20250127::
        flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::raw_hash_set(this_01,iVar1,0,(hasher *)((long)&iter.inner_.field_1 + 7),
                       (key_equal *)((long)&iter.inner_.field_1 + 6),this_00);
        iter.inner_.field_1._4_1_ = 0;
        std::
        allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&iter.inner_.field_1 + 5));
        local_180 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50;
        do {
          local_180 = local_180 + -1;
          std::
          pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_180);
        } while (local_180 != &local_110);
        GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
        ::bootstrap_mapping_abi_cxx11_ = this_01;
        __cxa_guard_release(&GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                             ::bootstrap_mapping_abi_cxx11_);
      }
    }
    _local_130 = (iterator)
                 absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                 ::find<std::basic_string_view<char,std::char_traits<char>>>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                             *)GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                               ::bootstrap_mapping_abi_cxx11_,
                            (key_arg<std::basic_string_view<char>_> *)&options_local);
    local_140 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                         ::bootstrap_mapping_abi_cxx11_);
    bVar2 = absl::lts_20250127::container_internal::operator==
                      ((const_iterator *)local_130,(const_iterator *)&local_140);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_160,(basic_string_view<char,_std::char_traits<char>_> *)&options_local,
                 &local_161);
      std::__cxx11::string::operator=((string *)local_50._32_8_,local_160);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
      basename_local._M_str._7_1_ = false;
    }
    else {
      ppVar4 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::const_iterator::operator->((const_iterator *)local_130);
      std::__cxx11::string::operator=((string *)local_50._32_8_,(string *)&ppVar4->second);
      basename_local._M_str._7_1_ = true;
    }
  }
  else {
    basename_local._M_str._7_1_ = false;
  }
  return basename_local._M_str._7_1_;
}

Assistant:

bool GetBootstrapBasename(const Options& options, absl::string_view basename,
                          std::string* bootstrap_basename) {
  if (options.opensource_runtime) {
    return false;
  }

  static const auto* bootstrap_mapping =
      // TODO Replace these with string_view once we remove
      // StringPiece.
      new absl::flat_hash_map<absl::string_view, std::string>{
          {"net/proto2/proto/descriptor",
           "third_party/protobuf/descriptor"},
          {"third_party/protobuf/cpp_features",
           "third_party/protobuf/cpp_features"},
          {"third_party/protobuf/compiler/plugin",
           "third_party/protobuf/compiler/plugin"},
          {"net/proto2/compiler/proto/profile",
           "net/proto2/compiler/proto/profile_bootstrap"},
      };
  auto iter = bootstrap_mapping->find(basename);
  if (iter == bootstrap_mapping->end()) {
    *bootstrap_basename = std::string(basename);
    return false;
  } else {
    *bootstrap_basename = iter->second;
    return true;
  }
}